

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# error.h
# Opt level: O2

void pbrt::Error<char_const*,char_const*>(char *fmt,char **args,char **args_1)

{
  char **in_R8;
  string local_28;
  
  StringPrintf<char_const*,char_const*>(&local_28,(pbrt *)fmt,(char *)args,args_1,in_R8);
  Error((FileLoc *)0x0,local_28._M_dataplus._M_p);
  std::__cxx11::string::~string((string *)&local_28);
  return;
}

Assistant:

inline void Error(const char *fmt, Args &&... args) {
    Error(nullptr, StringPrintf(fmt, std::forward<Args>(args)...).c_str());
}